

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayUtility.H
# Opt level: O0

value_type_conflict1
amrex::fudetail::
ReduceSum_host<amrex::FArrayBox,MacProj::check_div_cond(int,amrex::MultiFab*)const::__1,void>
          (FabArray<amrex::FArrayBox> *fa,IntVect *nghost,anon_class_1_0_00000001 *f)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  Real RVar2;
  Array4<const_double> *arr;
  Box *bx;
  MFIter mfi;
  value_type sm;
  MFIter *in_stack_fffffffffffffee0;
  FabArray<amrex::FArrayBox> *this;
  bool in_stack_ffffffffffffff07;
  FabArrayBase *in_stack_ffffffffffffff08;
  MFIter *in_stack_ffffffffffffff10;
  IntVect *in_stack_ffffffffffffff18;
  MFIter *in_stack_ffffffffffffff20;
  undefined1 local_a4 [36];
  element_type *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  local_20 = (element_type *)0x0;
  local_18._M_pi = in_RDX;
  MFIter::MFIter(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff07);
  while( true ) {
    bVar1 = MFIter::isValid((MFIter *)&stack0xffffffffffffff80);
    if (!bVar1) break;
    in_stack_fffffffffffffee0 = (MFIter *)local_a4;
    this = (FabArray<amrex::FArrayBox> *)&stack0xffffffffffffff80;
    MFIter::growntilebox(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    local_a4._28_8_ = in_stack_fffffffffffffee0;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(this,in_stack_fffffffffffffee0);
    RVar2 = MacProj::check_div_cond::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)local_18._M_pi,(Box *)local_a4._28_8_,
                       (Array4<const_double> *)&stack0xffffffffffffff10);
    local_20 = (element_type *)(RVar2 + (double)local_20);
    MFIter::operator++((MFIter *)&stack0xffffffffffffff80);
  }
  MFIter::~MFIter(in_stack_fffffffffffffee0);
  return (value_type_conflict1)local_20;
}

Assistant:

typename FAB::value_type
ReduceSum_host (FabArray<FAB> const& fa, IntVect const& nghost, F&& f)
{
    using value_type = typename FAB::value_type;
    value_type sm = 0;

#ifdef AMREX_USE_OMP
#pragma omp parallel if (!system::regtest_reduction) reduction(+:sm)
#endif
    for (MFIter mfi(fa,true); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.growntilebox(nghost);
        auto const& arr = fa.const_array(mfi);
        sm += f(bx, arr);
    }

    return sm;
}